

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

uint check_better_fast(MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,MV *best_mv,
                      SubpelMvLimits *mv_limits,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                      MV_COST_PARAMS *mv_cost_params,uint *besterr,uint *sse1,int *distortion,
                      int *has_better_mv,int is_scaled)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  MV MVar4;
  int iVar5;
  aom_variance_fn_ptr_t *paVar6;
  buf_2d *pbVar7;
  buf_2d *pbVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint uVar12;
  undefined8 in_RAX;
  uint uVar13;
  int iVar14;
  uint8_t *puVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  uint sse;
  
  sse = (uint)((ulong)in_RAX >> 0x20);
  MVar4 = *this_mv;
  uVar13 = 0x7fffffff;
  if ((((mv_limits->col_min <= (int)MVar4 >> 0x10) && ((int)MVar4 >> 0x10 <= mv_limits->col_max)) &&
      (mv_limits->row_min <= (int)MVar4.row)) && ((int)MVar4.row <= mv_limits->row_max)) {
    if (is_scaled == 0) {
      paVar6 = var_params->vfp;
      pbVar7 = (var_params->ms_buffers).ref;
      pbVar8 = (var_params->ms_buffers).src;
      iVar14 = pbVar7->stride;
      puVar15 = pbVar7->buf + (((int)MVar4 >> 0x13) + (((int)MVar4 << 0x10) >> 0x13) * iVar14);
      puVar9 = pbVar8->buf;
      iVar5 = pbVar8->stride;
      puVar10 = (var_params->ms_buffers).second_pred;
      uVar12 = (uint)MVar4 >> 0x10 & 7;
      uVar13 = (uint)MVar4 & 7;
      if (puVar10 == (uint8_t *)0x0) {
        uVar12 = (*paVar6->svf)(puVar15,iVar14,uVar12,uVar13,puVar9,iVar5,&sse);
      }
      else {
        puVar11 = (var_params->ms_buffers).mask;
        if (puVar11 == (uint8_t *)0x0) {
          uVar12 = (*paVar6->svaf)(puVar15,iVar14,uVar12,uVar13,puVar9,iVar5,&sse,puVar10);
        }
        else {
          uVar12 = (*paVar6->msvf)(puVar15,iVar14,uVar12,uVar13,puVar9,iVar5,puVar10,puVar11,
                                   (var_params->ms_buffers).mask_stride,
                                   (var_params->ms_buffers).inv_mask,&sse);
        }
      }
    }
    else {
      uVar12 = upsampled_pref_error(xd,cm,this_mv,var_params,&sse);
    }
    MVar1 = mv_cost_params->mv_cost_type;
    iVar14 = 0;
    if (MVar1 != '\x04') {
      sVar2 = mv_cost_params->ref_mv->row;
      sVar3 = mv_cost_params->ref_mv->col;
      sVar16 = this_mv->row - sVar2;
      sVar18 = this_mv->col - sVar3;
      sVar17 = -sVar16;
      if (0 < sVar16) {
        sVar17 = sVar16;
      }
      sVar19 = -sVar18;
      if (0 < sVar18) {
        sVar19 = sVar18;
      }
      if (MVar1 == '\x03') {
        iVar14 = (int)sVar19 + (int)sVar17 >> 3;
      }
      else if (MVar1 == '\x01') {
        iVar14 = (int)sVar19 + (int)sVar17 >> 2;
      }
      else if (MVar1 == '\0') {
        iVar14 = (int)(((long)mv_cost_params->mvcost[1][sVar18] +
                        (long)mv_cost_params->mvcost[0][sVar16] +
                       (long)*(int *)((long)mv_cost_params->mvjcost +
                                     (ulong)((uint)(this_mv->col != sVar3) * 4 +
                                            (uint)(this_mv->row != sVar2) * 8))) *
                       (long)mv_cost_params->error_per_bit + 0x2000U >> 0xe);
      }
    }
    uVar13 = iVar14 + uVar12;
    if (uVar13 < *besterr) {
      *besterr = uVar13;
      *best_mv = *this_mv;
      *distortion = uVar12;
      *sse1 = sse;
      *(byte *)has_better_mv = (byte)*has_better_mv | 1;
    }
  }
  return uVar13;
}

Assistant:

static inline unsigned int check_better_fast(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *this_mv, MV *best_mv,
    const SubpelMvLimits *mv_limits, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv, int is_scaled) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    int thismse;
    if (is_scaled) {
      thismse = upsampled_pref_error(xd, cm, this_mv, var_params, &sse);
    } else {
      thismse = estimated_pref_error(this_mv, var_params, &sse);
    }
    cost = mv_err_cost_(this_mv, mv_cost_params);
    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}